

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void VP8LTransformColor_C(VP8LMultipliers *m,uint32_t *data,int num_pixels)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < num_pixels) {
    uVar1 = m->green_to_red;
    uVar2 = m->green_to_blue;
    uVar3 = m->red_to_blue;
    uVar5 = 0;
    do {
      uVar4 = data[uVar5];
      iVar6 = (int)(char)(uVar4 >> 8);
      data[uVar5] = ((uVar4 >> 0x10) - ((uint)(iVar6 * (char)uVar1) >> 5) & 0xff) << 0x10 |
                    uVar4 & 0xff00ff00 |
                    uVar4 - (((uint)((int)(char)(uVar4 >> 0x10) * (int)(char)uVar3) >> 5) +
                            ((uint)(iVar6 * (char)uVar2) >> 5)) & 0xff;
      uVar5 = uVar5 + 1;
    } while ((uint)num_pixels != uVar5);
  }
  return;
}

Assistant:

void VP8LTransformColor_C(const VP8LMultipliers* WEBP_RESTRICT const m,
                          uint32_t* WEBP_RESTRICT data, int num_pixels) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = data[i];
    const int8_t green = U32ToS8(argb >>  8);
    const int8_t red   = U32ToS8(argb >> 16);
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red -= ColorTransformDelta((int8_t)m->green_to_red, green);
    new_red &= 0xff;
    new_blue -= ColorTransformDelta((int8_t)m->green_to_blue, green);
    new_blue -= ColorTransformDelta((int8_t)m->red_to_blue, red);
    new_blue &= 0xff;
    data[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}